

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  byte bVar1;
  undefined4 uVar2;
  pointer names_00;
  pointer ppNVar3;
  bool bVar4;
  char *in_00;
  Reference *this;
  ValueType floatType;
  undefined4 in_register_00000014;
  byte *in_01;
  Value *local_78;
  undefined8 local_70;
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *local_48;
  
  local_70 = CONCAT44(in_register_00000014,type);
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  if (((in != end && in != (char *)0x0) && (in = lookForNextToken<char>(in,end), in != end)) &&
     (*in == 0x7b)) {
    in_01 = (byte *)in + 1;
    local_48 = (Value *)0x0;
    uVar2 = (undefined4)local_70;
    do {
      if ((in_01 == (byte *)end) || (*in_01 == 0x7d)) break;
      local_78 = (Value *)0x0;
      in_00 = lookForNextToken<char>((char *)in_01,end);
      floatType = (ValueType)local_70;
      switch(uVar2) {
      default:
        goto switchD_00149be7_caseD_0;
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
      case 8:
LAB_00149bf7:
        in_00 = parseIntegerLiteral(in_00,end,&local_78,floatType);
        break;
      case 9:
      case 10:
      case 0xb:
LAB_00149c0f:
        in_00 = parseFloatingLiteral(in_00,end,&local_78,floatType);
        break;
      case 0xc:
switchD_00149be7_caseD_c:
        in_00 = parseStringLiteral(in_00,end,&local_78);
        break;
      case 0xd:
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        in_00 = parseReference(in_00,end,&names);
        ppNVar3 = names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        names_00 = names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this = (Reference *)operator_new(0x10);
          Reference::Reference(this,(long)ppNVar3 - (long)names_00 >> 3,names_00);
          *refs = this;
          *numRefs = (long)names.
                           super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)names.
                           super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3;
        }
        std::_Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::~_Vector_base
                  (&names.
                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>);
        break;
      case 0xffffffff:
        bVar4 = isInteger<char>(in_00,end);
        if (bVar4) {
          floatType = ddl_int32;
          goto LAB_00149bf7;
        }
        bVar4 = isFloat<char>(in_00,end);
        if (bVar4) {
          floatType = ddl_float;
          goto LAB_00149c0f;
        }
        if (*in_00 == '\"') goto switchD_00149be7_caseD_c;
        bVar4 = isHexLiteral<char>(in_00,end);
        if (bVar4) {
          in_00 = parseHexaLiteral(in_00,end,&local_78);
        }
      }
      if (local_78 != (Value *)0x0) {
        if (*data == (Value *)0x0) {
          *data = local_78;
        }
        else {
          Value::setNext(local_48,local_78);
        }
        *numValues = *numValues + 1;
        local_48 = local_78;
      }
switchD_00149be7_caseD_0:
      in_01 = (byte *)getNextSeparator<char>(in_00,end);
      if (in_01 == (byte *)end) break;
      bVar1 = *in_01;
    } while ((((ulong)bVar1 < 0x2d) && ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
            (bVar1 == 0x7d));
    in = (char *)(in_01 + (in_01 != (byte *)end));
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseDataList(char *in, char *end, Value::ValueType type, Value **data,
        size_t &numValues, Reference **refs, size_t &numRefs) {
    *data = nullptr;
    numValues = numRefs = 0;
    if (nullptr == in || in == end) {
        return in;
    }

    in = lookForNextToken(in, end);
    if (in != end && *in == '{') {
        ++in;
        Value *current(nullptr), *prev(nullptr);
        while (in != end && '}' != *in) {
            current = nullptr;
            in = lookForNextToken(in, end);
            if (Value::ValueType::ddl_ref == type) {
                std::vector<Name *> names;
                in = parseReference(in, end, names);
                if (!names.empty()) {
                    Reference *ref = new Reference(names.size(), &names[0]);
                    *refs = ref;
                    numRefs = names.size();
                }
            } else if (Value::ValueType::ddl_none == type) {
                if (isInteger(in, end)) {
                    in = parseIntegerLiteral(in, end, &current);
                } else if (isFloat(in, end)) {
                    in = parseFloatingLiteral(in, end, &current);
                } else if (isStringLiteral(*in)) {
                    in = parseStringLiteral(in, end, &current);
                } else if (isHexLiteral(in, end)) {
                    in = parseHexaLiteral(in, end, &current);
                }
            } else {
                switch (type) {
                    case Value::ValueType::ddl_int8:
                    case Value::ValueType::ddl_int16:
                    case Value::ValueType::ddl_int32:
                    case Value::ValueType::ddl_int64:
                    case Value::ValueType::ddl_unsigned_int8:
                    case Value::ValueType::ddl_unsigned_int16:
                    case Value::ValueType::ddl_unsigned_int32:
                    case Value::ValueType::ddl_unsigned_int64:
                        in = parseIntegerLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_half:
                    case Value::ValueType::ddl_float:
                    case Value::ValueType::ddl_double:
                        in = parseFloatingLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_string:
                        in = parseStringLiteral(in, end, &current);
                        break;
                    default:
                        break;
                }
            }

            if (nullptr != current) {
                if (nullptr == *data) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext(current);
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator(in, end);
            if (in == end || (',' != *in && Grammar::CloseBracketToken[0] != *in && !isSpace(*in))) {
                break;
            }
        }
        if (in != end)
            ++in;
    }

    return in;
}